

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_dec_utils.c
# Opt level: O0

MPP_RET reader_read(FileReader reader,FileBufSlot **buf)

{
  FileBufSlot *pFVar1;
  FileBufSlot *slot;
  FileReaderImpl *impl;
  FileBufSlot **buf_local;
  FileReader reader_local;
  
  if ((reader == (FileReader)0x0) || (*(long *)((long)reader + 0x70) == 0)) {
    _mpp_log_l(4,"mpi_dec_utils","invalid reader %p\n","reader_read",reader);
    reader_local._4_4_ = MPP_NOK;
  }
  else if (*(uint *)((long)reader + 0x6c) < *(uint *)((long)reader + 100)) {
    do {
      pFVar1 = *(FileBufSlot **)
                (*(long *)((long)reader + 0x70) + (ulong)*(uint *)((long)reader + 0x6c) * 8);
      if ((pFVar1 == (FileBufSlot *)0x0) ||
         (*(uint *)((long)reader + 0x68) < *(uint *)((long)reader + 0x6c))) {
        usleep(1000);
      }
    } while (pFVar1 == (FileBufSlot *)0x0);
    if ((pFVar1 == (FileBufSlot *)0x0) &&
       (_mpp_log_l(2,"mpi_dec_utils","Assertion %s failed at %s:%d\n",0,"slot","reader_read",0x113),
       (_mpp_debug & 0x10000000) != 0)) {
      abort();
    }
    *buf = pFVar1;
    *(int *)((long)reader + 0x6c) = *(int *)((long)reader + 0x6c) + 1;
    reader_local._4_4_ = MPP_OK;
  }
  else {
    _mpp_log_l(4,"mpi_dec_utils","invalid read index % max %d\n","reader_read",
               *(undefined4 *)((long)reader + 0x6c),*(undefined4 *)((long)reader + 100));
    reader_local._4_4_ = MPP_NOK;
  }
  return reader_local._4_4_;
}

Assistant:

MPP_RET reader_read(FileReader reader, FileBufSlot **buf)
{
    FileReaderImpl *impl = (FileReaderImpl*)reader;
    FileBufSlot *slot = NULL;

    if (NULL == impl || NULL == impl->slots) {
        mpp_log_f("invalid reader %p\n", reader);
        return MPP_NOK;
    }

    if (impl->slot_rd_idx >= impl->slot_max) {
        mpp_log_f("invalid read index % max %d\n", impl->slot_rd_idx, impl->slot_max);
        return MPP_NOK;
    }

    do {
        slot = impl->slots[impl->slot_rd_idx];
        if (slot == NULL || (impl->slot_rd_idx > impl->slot_cnt))
            msleep(1);
    } while (slot == NULL);

    mpp_assert(slot);

    *buf  = slot;
    impl->slot_rd_idx++;

    return MPP_OK;
}